

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalRestart(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3Phrase *pPhrase_00;
  int iVar1;
  Fts3PhraseToken *pToken;
  int i;
  Fts3Phrase *pPhrase;
  int *pRc_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  if ((pExpr != (Fts3Expr *)0x0) && (*pRc == 0)) {
    pPhrase_00 = pExpr->pPhrase;
    if (pPhrase_00 != (Fts3Phrase *)0x0) {
      fts3EvalInvalidatePoslist(pPhrase_00);
      if (pPhrase_00->bIncr != 0) {
        for (pToken._4_4_ = 0; pToken._4_4_ < pPhrase_00->nToken; pToken._4_4_ = pToken._4_4_ + 1) {
          if (pPhrase_00->aToken[pToken._4_4_].pSegcsr != (Fts3MultiSegReader *)0x0) {
            sqlite3Fts3MsrIncrRestart(pPhrase_00->aToken[pToken._4_4_].pSegcsr);
          }
        }
        iVar1 = fts3EvalPhraseStart(pCsr,0,pPhrase_00);
        *pRc = iVar1;
      }
      (pPhrase_00->doclist).pNextDocid = (char *)0x0;
      (pPhrase_00->doclist).iDocid = 0;
      pPhrase_00->pOrPoslist = (char *)0x0;
    }
    pExpr->iDocid = 0;
    pExpr->bEof = '\0';
    pExpr->bStart = '\0';
    fts3EvalRestart(pCsr,pExpr->pLeft,pRc);
    fts3EvalRestart(pCsr,pExpr->pRight,pRc);
  }
  return;
}

Assistant:

static void fts3EvalRestart(
  Fts3Cursor *pCsr,
  Fts3Expr *pExpr,
  int *pRc
){
  if( pExpr && *pRc==SQLITE_OK ){
    Fts3Phrase *pPhrase = pExpr->pPhrase;

    if( pPhrase ){
      fts3EvalInvalidatePoslist(pPhrase);
      if( pPhrase->bIncr ){
        int i;
        for(i=0; i<pPhrase->nToken; i++){
          Fts3PhraseToken *pToken = &pPhrase->aToken[i];
          assert( pToken->pDeferred==0 );
          if( pToken->pSegcsr ){
            sqlite3Fts3MsrIncrRestart(pToken->pSegcsr);
          }
        }
        *pRc = fts3EvalPhraseStart(pCsr, 0, pPhrase);
      }
      pPhrase->doclist.pNextDocid = 0;
      pPhrase->doclist.iDocid = 0;
      pPhrase->pOrPoslist = 0;
    }

    pExpr->iDocid = 0;
    pExpr->bEof = 0;
    pExpr->bStart = 0;

    fts3EvalRestart(pCsr, pExpr->pLeft, pRc);
    fts3EvalRestart(pCsr, pExpr->pRight, pRc);
  }
}